

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

int dwarf_highpc_b(Dwarf_Die die,Dwarf_Addr *return_value,Dwarf_Half *return_form,
                  Dwarf_Form_Class *return_class,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  Dwarf_Byte_Ptr pDVar2;
  int iVar3;
  Dwarf_Bool DVar4;
  uint form;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  Dwarf_Signed DStack_90;
  Dwarf_Half attr_form;
  Dwarf_Half local_7a;
  Dwarf_Addr _ltmp;
  Dwarf_Unsigned index_to_addr;
  Dwarf_Form_Class local_64;
  Dwarf_Byte_Ptr local_60;
  Dwarf_Byte_Ptr info_ptr;
  Dwarf_Form_Class *local_50;
  ulong local_48;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  
  info_ptr = (Dwarf_Byte_Ptr)0x0;
  attr_form = 0;
  if (die == (Dwarf_Die)0x0) {
    DStack_90 = 0x34;
  }
  else {
    pDVar1 = die->di_cu_context;
    if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
      dbg = pDVar1->cc_dbg;
      if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
        msg = 
        "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
        ;
        errval = 0x51;
        dbg = (Dwarf_Debug)0x0;
LAB_00170dfb:
        _dwarf_error_string(dbg,error,errval,msg);
        return 1;
      }
      local_48 = (ulong)pDVar1->cc_address_size;
      iVar3 = _dwarf_get_value_ptr(die,0x12,&attr_form,&info_ptr,(Dwarf_Signed *)0x0,error);
      if (iVar3 == -1) {
        return -1;
      }
      if (iVar3 == 1) {
        return 1;
      }
      pDVar1 = die->di_cu_context;
      local_50 = return_class;
      local_60 = _dwarf_calculate_info_section_end_ptr(pDVar1);
      local_7a = attr_form;
      form = (uint)attr_form;
      local_64 = dwarf_get_form_class
                           (pDVar1->cc_version_stamp,0x12,(ushort)pDVar1->cc_length_size,attr_form);
      if (local_64 == DW_FORM_CLASS_ADDRESS) {
        DVar4 = dwarf_addr_form_is_indexed(form);
        pDVar2 = info_ptr;
        if (DVar4 != 0) {
          index_to_addr = 0;
          pDVar1 = die->di_cu_context;
          iVar3 = _dwarf_get_addr_index_itself(form,info_ptr,dbg,pDVar1,&index_to_addr,error);
          if (iVar3 != 0) {
            return iVar3;
          }
          iVar3 = _dwarf_look_in_local_and_tied_by_index(dbg,pDVar1,index_to_addr,&_ltmp,error);
          if (iVar3 != 0) {
            return iVar3;
          }
        }
        _ltmp = 0;
        if (local_60 < pDVar2 + local_48) {
          msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          errval = 0x14b;
          goto LAB_00170dfb;
        }
        (*dbg->de_copy_word)(&_ltmp,pDVar2,local_48);
      }
      else {
        _ltmp = 0;
        iVar3 = _dwarf_die_attr_unsigned_constant(die,0x12,&_ltmp,error);
        if (iVar3 != 0) {
          index_to_addr = 0;
          iVar3 = _dwarf_get_value_ptr
                            (die,0x12,&attr_form,(Dwarf_Byte_Ptr *)&index_to_addr,
                             (Dwarf_Signed *)0x0,error);
          if (iVar3 == -1) {
            return -1;
          }
          if (iVar3 == 1) {
            return 1;
          }
          if (attr_form == 0xd) {
            lu_leblen = 0;
            lu_local = 0;
            iVar3 = dwarf_decode_leb128((char *)index_to_addr,&lu_leblen,&lu_local,(char *)local_60)
            ;
            if (iVar3 == 1) {
              msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
              errval = 0x149;
              goto LAB_00170dfb;
            }
            *return_value = lu_local;
            local_7a = 0xd;
            goto LAB_00170ec4;
          }
          DStack_90 = 0x18d;
          goto LAB_00170e0a;
        }
      }
      *return_value = _ltmp;
LAB_00170ec4:
      if (return_form != (Dwarf_Half *)0x0) {
        *return_form = local_7a;
      }
      if (local_50 != (Dwarf_Form_Class *)0x0) {
        *local_50 = local_64;
        return 0;
      }
      return 0;
    }
    DStack_90 = 0x68;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_00170e0a:
  _dwarf_error(dbg,error,DStack_90);
  return 1;
}

Assistant:

int
dwarf_highpc_b(Dwarf_Die die,
    Dwarf_Addr *return_value,
    Dwarf_Half *return_form,
    enum Dwarf_Form_Class *return_class,
    Dwarf_Error *error)
{
    Dwarf_Byte_Ptr info_ptr = 0;
    Dwarf_Half attr_form = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Half address_size = 0;
    Dwarf_Half offset_size = 0;
    enum Dwarf_Form_Class class = DW_FORM_CLASS_UNKNOWN;
    Dwarf_Half version = 0;
    Dwarf_Byte_Ptr die_info_end = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    address_size = die->di_cu_context->cc_address_size;

    res = _dwarf_get_value_ptr(die, DW_AT_high_pc,
        &attr_form,&info_ptr,0,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    die_info_end = _dwarf_calculate_info_section_end_ptr(
        die->di_cu_context);

    version = die->di_cu_context->cc_version_stamp;
    offset_size = die->di_cu_context->cc_length_size;
    class = dwarf_get_form_class(version,DW_AT_high_pc,
        offset_size,attr_form);

    if (class == DW_FORM_CLASS_ADDRESS) {
        Dwarf_Addr addr = 0;
        if (dwarf_addr_form_is_indexed(attr_form)) {
            Dwarf_Unsigned addr_out = 0;
            Dwarf_Unsigned index_to_addr = 0;
            int res2 = 0;
            Dwarf_CU_Context context = die->di_cu_context;

            /*  index_to_addr we get here might apply
                to this dbg or to tieddbg. */
            /* error is returned on dbg, not tied */
            res2 = _dwarf_get_addr_index_itself(attr_form,
                info_ptr,dbg,context,&index_to_addr,error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
            res2= _dwarf_look_in_local_and_tied_by_index(dbg,
                context,
                index_to_addr,
                &addr_out,
                error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
        }
        READ_UNALIGNED_CK(dbg, addr, Dwarf_Addr,
            info_ptr, address_size,
            error,die_info_end);
        *return_value = addr;
    } else {
        int res3 = 0;
        Dwarf_Unsigned v = 0;
        res3 = _dwarf_die_attr_unsigned_constant(die,DW_AT_high_pc,
            &v,error);
        if (res3 != DW_DLV_OK) {
            Dwarf_Byte_Ptr info_ptr2 = 0;

            res3 = _dwarf_get_value_ptr(die, DW_AT_high_pc,
                &attr_form,&info_ptr2,0,error);
            if (res3 == DW_DLV_ERROR) {
                return res3;
            }
            if (res3 == DW_DLV_NO_ENTRY) {
                return res3;
            }
            if (attr_form == DW_FORM_sdata) {
                Dwarf_Signed sval = 0;

                /*  DWARF4 defines the value as an unsigned offset
                    in section 2.17.2. */
                DECODE_LEB128_UWORD_CK(info_ptr2, sval,
                    dbg,error,die_info_end);
                *return_value = (Dwarf_Unsigned)sval;
            } else {
                _dwarf_error(dbg, error, DW_DLE_HIGHPC_WRONG_FORM);
                return DW_DLV_ERROR;
            }
        } else {
            *return_value = v;
        }
    }
    /*  Allow null args starting 22 April 2019. */
    if (return_form) {
        *return_form = attr_form;
    }
    if (return_class) {
        *return_class = class;
    }
    return DW_DLV_OK;
}